

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_ObjPrintVerboseCone(Aig_Man_t *p,Aig_Obj_t *pRoot,int fHaig)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pObj_00;
  int local_34;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Aig_Obj_t *pAStack_18;
  int fHaig_local;
  Aig_Obj_t *pRoot_local;
  Aig_Man_t *p_local;
  
  pAStack_18 = pRoot;
  pRoot_local = (Aig_Obj_t *)p;
  p_00 = Aig_ManDfsArray(p,&stack0xffffffffffffffe8,1);
  for (local_34 = 0; iVar1 = Vec_PtrSize(p_00), local_34 < iVar1; local_34 = local_34 + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_34);
    Aig_ObjPrintVerbose(pObj_00,fHaig);
    printf("\n");
  }
  printf("\n");
  Vec_PtrFree(p_00);
  return;
}

Assistant:

void Aig_ObjPrintVerboseCone( Aig_Man_t * p, Aig_Obj_t * pRoot, int fHaig )
{
    extern Vec_Ptr_t * Aig_ManDfsArray( Aig_Man_t * p, Aig_Obj_t ** pNodes, int nNodes );
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    vNodes = Aig_ManDfsArray( p, &pRoot, 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Aig_ObjPrintVerbose( pObj, fHaig ), printf( "\n" );
    printf( "\n" );
    Vec_PtrFree( vNodes );

}